

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O1

bool tinyusdz::anon_unknown_160::ExtractVariantsRec
               (uint32_t depth,string *root_path,Prim *prim,Dictionary *dict,uint32_t max_depth,
               string *err)

{
  pointer pcVar1;
  value_type *pvVar2;
  size_type sVar3;
  _Base_ptr p_Var4;
  Prim *pPVar5;
  bool bVar6;
  long *plVar7;
  PrimMeta *pPVar8;
  mapped_type *pmVar9;
  _Rb_tree_node_base *p_Var10;
  _Rb_tree_node_base *p_Var11;
  size_type *psVar12;
  char *pcVar13;
  Token *item;
  value_type *__x;
  uint32_t depth_00;
  undefined4 in_register_00000084;
  uint32_t max_depth_00;
  Prim *prim_00;
  bool bVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  Dictionary vsetdict;
  Dictionary values;
  string full_prim_path;
  Dictionary variantInfos;
  storage_union local_150;
  vtable_type *local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  undefined8 local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  char *local_118;
  Prim *local_110;
  Dictionary *local_108;
  _Rb_tree_node_base *local_100;
  undefined1 local_f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  uint32_t local_bc;
  undefined1 local_b8 [8];
  pointer pbStack_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Base_ptr local_98;
  size_t local_90;
  key_type local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
  local_60;
  
  pcVar13 = (char *)CONCAT44(in_register_00000084,max_depth);
  local_108 = dict;
  local_bc = depth;
  if (0x100000 < depth) {
    if (pcVar13 != (char *)0x0) {
      ::std::__cxx11::string::append(pcVar13);
    }
    return false;
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((prim->_elementPath)._prim_part._M_string_length == 0) {
    if (pcVar13 != (char *)0x0) {
      ::std::__cxx11::string::append(pcVar13);
    }
    bVar14 = false;
    goto LAB_001b24b0;
  }
  pcVar1 = (root_path->_M_dataplus)._M_p;
  local_150.dynamic = &local_140;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_150,pcVar1,pcVar1 + root_path->_M_string_length);
  ::std::__cxx11::string::append((char *)&local_150);
  plVar7 = (long *)::std::__cxx11::string::_M_append
                             ((char *)&local_150,
                              (ulong)(prim->_elementPath)._prim_part._M_dataplus._M_p);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  psVar12 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_80.field_2._M_allocated_capacity = *psVar12;
    local_80.field_2._8_8_ = plVar7[3];
  }
  else {
    local_80.field_2._M_allocated_capacity = *psVar12;
    local_80._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_80._M_string_length = plVar7[1];
  *plVar7 = (long)psVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((vtable_type **)local_150.dynamic != &local_140) {
    operator_delete(local_150.dynamic,(ulong)((long)&local_140->type_id + 1));
  }
  pPVar8 = Prim::metas(prim);
  local_118 = pcVar13;
  local_110 = prim;
  if ((pPVar8->variantSets).has_value_ == true) {
    pPVar8 = Prim::metas(prim);
    if ((pPVar8->variantSets).has_value_ == false) {
      pcVar13 = 
      "const value_type &nonstd::optional_lite::optional<std::pair<tinyusdz::ListEditQual, std::vector<std::basic_string<char>>>>::value() const [T = std::pair<tinyusdz::ListEditQual, std::vector<std::basic_string<char>>>]"
      ;
      goto LAB_001b2518;
    }
    local_140 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
    local_150.dynamic = (vtable_type **)0x0;
    local_130 = 0;
    local_128._M_local_buf[0] = '\0';
    local_138 = &local_128;
    MetaVariable::set_value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((MetaVariable *)&local_150,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&(pPVar8->variantSets).contained + 8));
    local_f8._0_8_ = &local_e8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"variantSets","");
    pmVar9 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                           *)&local_60,(key_type *)local_f8);
    ::std::__cxx11::string::_M_assign((string *)&pmVar9->_name);
    linb::any::operator=((any *)pmVar9,(any *)&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._0_8_ != &local_e8) {
      operator_delete((void *)local_f8._0_8_,(ulong)(local_e8._M_allocated_capacity + 1));
    }
    if (local_138 != &local_128) {
      operator_delete(local_138,
                      CONCAT71(local_128._M_allocated_capacity._1_7_,local_128._M_local_buf[0]) + 1)
      ;
    }
    prim = local_110;
    pcVar13 = local_118;
    if (local_140 != (vtable_type *)0x0) {
      (*local_140->destroy)(&local_150);
      local_140 = (vtable_type *)0x0;
    }
  }
  max_depth_00 = (uint32_t)pcVar13;
  pPVar8 = Prim::metas(prim);
  if ((pPVar8->variants).has_value_ == true) {
    local_a8._8_8_ = &pbStack_b0;
    pbStack_b0 = (pointer)((ulong)pbStack_b0 & 0xffffffff00000000);
    local_a8._M_allocated_capacity = 0;
    local_90 = 0;
    local_98 = (_Base_ptr)local_a8._8_8_;
    pPVar8 = Prim::metas(prim);
    if ((pPVar8->variants).has_value_ == false) {
      pcVar13 = 
      "const value_type &nonstd::optional_lite::optional<std::map<std::basic_string<char>, std::basic_string<char>>>::value() const [T = std::map<std::basic_string<char>, std::basic_string<char>>]"
      ;
      goto LAB_001b2518;
    }
    p_Var10 = *(_Rb_tree_node_base **)((long)&(pPVar8->variants).contained + 0x18);
    p_Var11 = (_Rb_tree_node_base *)((long)&(pPVar8->variants).contained + 8);
    if (p_Var10 != p_Var11) {
      local_100 = p_Var11;
      do {
        local_140 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
        local_150.dynamic = (void *)0x0;
        local_130 = 0;
        local_128._M_local_buf[0] = '\0';
        local_138 = &local_128;
        MetaVariable::set_value<std::__cxx11::string>
                  ((MetaVariable *)&local_150,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (p_Var10 + 2));
        local_e8._M_allocated_capacity =
             (size_type)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
        local_f8._0_8_ = (undefined ***)0x0;
        local_d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
        local_d0._M_allocated_capacity = local_d0._M_allocated_capacity & 0xffffffffffffff00;
        local_e8._8_8_ = &local_d0;
        MetaVariable::set_value<std::__cxx11::string>
                  ((MetaVariable *)local_f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (p_Var10 + 2));
        pmVar9 = ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                               *)local_b8,(key_type *)(p_Var10 + 1));
        ::std::__cxx11::string::_M_assign((string *)&pmVar9->_name);
        linb::any::operator=((any *)pmVar9,(any *)local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._8_8_ != &local_d0) {
          operator_delete((void *)local_e8._8_8_,local_d0._M_allocated_capacity + 1);
        }
        if ((_Link_type)local_e8._M_allocated_capacity != (_Link_type)0x0) {
          (**(code **)((__aligned_membuf<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>
                        *)(local_e8._M_allocated_capacity + 0x20))->_M_storage)(local_f8);
          local_e8._M_allocated_capacity = 0;
        }
        if (local_138 != &local_128) {
          operator_delete(local_138,
                          CONCAT71(local_128._M_allocated_capacity._1_7_,local_128._M_local_buf[0])
                          + 1);
        }
        if (local_140 != (vtable_type *)0x0) {
          (*local_140->destroy)(&local_150);
          local_140 = (vtable_type *)0x0;
        }
        p_Var10 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var10);
      } while (p_Var10 != local_100);
    }
    local_140 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
    local_150.dynamic = (vtable_type **)0x0;
    local_130 = 0;
    local_128._M_local_buf[0] = '\0';
    local_138 = &local_128;
    MetaVariable::
    set_value<std::map<std::__cxx11::string,tinyusdz::MetaVariable,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>>>>
              ((MetaVariable *)&local_150,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                *)local_b8);
    local_f8._0_8_ = &local_e8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"variants","");
    pmVar9 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                           *)&local_60,(key_type *)local_f8);
    ::std::__cxx11::string::_M_assign((string *)&pmVar9->_name);
    linb::any::operator=((any *)pmVar9,(any *)&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._0_8_ != &local_e8) {
      operator_delete((void *)local_f8._0_8_,(ulong)(local_e8._M_allocated_capacity + 1));
    }
    if (local_138 != &local_128) {
      operator_delete(local_138,
                      CONCAT71(local_128._M_allocated_capacity._1_7_,local_128._M_local_buf[0]) + 1)
      ;
    }
    prim = local_110;
    max_depth_00 = (uint32_t)local_118;
    if (local_140 != (vtable_type *)0x0) {
      (*local_140->destroy)(&local_150);
      local_140 = (vtable_type *)0x0;
    }
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
    ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                *)local_b8,(_Link_type)local_a8._M_allocated_capacity);
  }
  pPVar8 = Prim::metas(prim);
  if ((pPVar8->variantSetChildren).has_value_ == true) {
    pPVar8 = Prim::metas(prim);
    if ((pPVar8->variantSetChildren).has_value_ == false) {
      pcVar13 = 
      "const value_type &nonstd::optional_lite::optional<std::vector<tinyusdz::Token>>::value() const [T = std::vector<tinyusdz::Token>]"
      ;
LAB_001b2518:
      __assert_fail("has_value()",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                    ,0x584,pcVar13);
    }
    local_b8 = (undefined1  [8])0x0;
    pbStack_b0 = (pointer)0x0;
    local_a8._M_allocated_capacity = 0;
    __x = *(value_type **)&(pPVar8->variantSetChildren).contained;
    pvVar2 = *(value_type **)((long)&(pPVar8->variantSetChildren).contained + 8);
    bVar14 = __x == pvVar2;
    if (!bVar14) {
      do {
        sVar3 = __x->_M_string_length;
        if (sVar3 == 0) {
          if (local_118 != (char *)0x0) {
            ::std::__cxx11::string::append(local_118);
          }
        }
        else {
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_b8,__x);
        }
        if (sVar3 == 0) {
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_b8);
          goto LAB_001b2489;
        }
        __x = __x + 1;
        bVar14 = __x == pvVar2;
      } while (!bVar14);
    }
    local_140 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
    local_150.dynamic = (vtable_type **)0x0;
    local_130 = 0;
    local_128._M_local_buf[0] = '\0';
    local_138 = &local_128;
    MetaVariable::set_value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((MetaVariable *)&local_150,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_b8);
    local_f8._0_8_ = &local_e8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"variantSet","");
    pmVar9 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                           *)&local_60,(key_type *)local_f8);
    ::std::__cxx11::string::_M_assign((string *)&pmVar9->_name);
    linb::any::operator=((any *)pmVar9,(any *)&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._0_8_ != &local_e8) {
      operator_delete((void *)local_f8._0_8_,(ulong)(local_e8._M_allocated_capacity + 1));
    }
    if (local_138 != &local_128) {
      operator_delete(local_138,
                      CONCAT71(local_128._M_allocated_capacity._1_7_,local_128._M_local_buf[0]) + 1)
      ;
    }
    prim = local_110;
    max_depth_00 = (uint32_t)local_118;
    if (local_140 != (vtable_type *)0x0) {
      (*local_140->destroy)(&local_150);
      local_140 = (vtable_type *)0x0;
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_b8);
    if (bVar14) goto LAB_001b2344;
LAB_001b2489:
    bVar14 = false;
  }
  else {
    if ((prim->_variantSets)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      local_e8._8_8_ = local_f8 + 8;
      local_f8._8_4_ = 0;
      local_e8._M_allocated_capacity = 0;
      local_d0._M_allocated_capacity = 0;
      p_Var11 = (prim->_variantSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var10 = &(prim->_variantSets)._M_t._M_impl.super__Rb_tree_header._M_header;
      bVar14 = p_Var11 == p_Var10;
      local_d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_e8._8_8_;
      if (!bVar14) {
        local_100 = p_Var10;
        do {
          if (p_Var11[4]._M_parent != (_Base_ptr)0x0) {
            local_b8 = (undefined1  [8])0x0;
            pbStack_b0 = (pointer)0x0;
            local_a8._M_allocated_capacity = 0;
            p_Var4 = p_Var11[2]._M_parent;
            if (p_Var4 == (_Base_ptr)0x0) {
              if (local_118 != (char *)0x0) {
                ::std::__cxx11::string::append(local_118);
              }
            }
            else {
              for (p_Var10 = p_Var11[3]._M_right;
                  p_Var10 != (_Rb_tree_node_base *)&p_Var11[3]._M_parent;
                  p_Var10 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var10)) {
                ::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_b8,(value_type *)(p_Var10 + 1));
              }
              local_140 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
              local_150.dynamic = (vtable_type **)0x0;
              local_130 = 0;
              local_128._M_local_buf[0] = '\0';
              local_138 = &local_128;
              MetaVariable::
              set_value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        ((MetaVariable *)&local_150,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_b8);
              pmVar9 = ::std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                     *)local_f8,(key_type *)(p_Var11 + 1));
              ::std::__cxx11::string::_M_assign((string *)&pmVar9->_name);
              linb::any::operator=((any *)pmVar9,(any *)&local_150);
              if (local_138 != &local_128) {
                operator_delete(local_138,
                                CONCAT71(local_128._M_allocated_capacity._1_7_,
                                         local_128._M_local_buf[0]) + 1);
              }
              p_Var10 = local_100;
              if (local_140 != (vtable_type *)0x0) {
                (*local_140->destroy)(&local_150);
                local_140 = (vtable_type *)0x0;
              }
            }
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_b8);
            if (p_Var4 == (_Base_ptr)0x0) {
              ::std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
              ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                          *)local_f8,(_Link_type)local_e8._M_allocated_capacity);
              goto LAB_001b2489;
            }
          }
          p_Var11 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var11);
          bVar14 = p_Var11 == p_Var10;
        } while (!bVar14);
      }
      if (local_d0._M_allocated_capacity != 0) {
        local_140 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
        local_150.dynamic = (vtable_type **)0x0;
        local_130 = 0;
        local_128._M_local_buf[0] = '\0';
        local_138 = &local_128;
        MetaVariable::
        set_value<std::map<std::__cxx11::string,tinyusdz::MetaVariable,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>>>>
                  ((MetaVariable *)&local_150,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                    *)local_f8);
        local_b8 = (undefined1  [8])&local_a8;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"variantSet","");
        pmVar9 = ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                               *)&local_60,(key_type *)local_b8);
        ::std::__cxx11::string::_M_assign((string *)&pmVar9->_name);
        linb::any::operator=((any *)pmVar9,(any *)&local_150);
        if (local_b8 != (undefined1  [8])&local_a8) {
          operator_delete((void *)local_b8,(ulong)(local_a8._M_allocated_capacity + 1));
        }
        if (local_138 != &local_128) {
          operator_delete(local_138,
                          CONCAT71(local_128._M_allocated_capacity._1_7_,local_128._M_local_buf[0])
                          + 1);
        }
        if (local_140 != (vtable_type *)0x0) {
          (*local_140->destroy)(&local_150);
          local_140 = (vtable_type *)0x0;
        }
      }
      ::std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
      ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                  *)local_f8,(_Link_type)local_e8._M_allocated_capacity);
      max_depth_00 = (uint32_t)local_118;
      prim = local_110;
      if (!bVar14) goto LAB_001b2489;
    }
LAB_001b2344:
    if (local_60._M_impl.super__Rb_tree_header._M_node_count != 0) {
      local_140 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
      local_150.dynamic = (vtable_type **)0x0;
      local_130 = 0;
      local_128._M_local_buf[0] = '\0';
      local_138 = &local_128;
      MetaVariable::
      set_value<std::map<std::__cxx11::string,tinyusdz::MetaVariable,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>>>>
                ((MetaVariable *)&local_150,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                  *)&local_60);
      pmVar9 = ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
               ::operator[](local_108,&local_80);
      ::std::__cxx11::string::_M_assign((string *)&pmVar9->_name);
      linb::any::operator=((any *)pmVar9,(any *)&local_150);
      if (local_138 != &local_128) {
        operator_delete(local_138,
                        CONCAT71(local_128._M_allocated_capacity._1_7_,local_128._M_local_buf[0]) +
                        1);
      }
      prim = local_110;
      if (local_140 != (vtable_type *)0x0) {
        (*local_140->destroy)(&local_150);
        local_140 = (vtable_type *)0x0;
        prim = local_110;
      }
    }
    prim_00 = (prim->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pPVar5 = (prim->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    bVar14 = prim_00 == pPVar5;
    if (!bVar14) {
      depth_00 = local_bc + 1;
      bVar6 = ExtractVariantsRec(depth_00,&local_80,prim_00,local_108,max_depth_00,err);
      if (bVar6) {
        do {
          prim_00 = prim_00 + 1;
          bVar14 = prim_00 == pPVar5;
          if (bVar14) break;
          bVar6 = ExtractVariantsRec(depth_00,&local_80,prim_00,local_108,max_depth_00,err);
        } while (bVar6);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
LAB_001b24b0:
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
  ::_M_erase(&local_60,(_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent);
  return bVar14;
}

Assistant:

bool ExtractVariantsRec(uint32_t depth, const std::string &root_path,
                        const Prim &prim, Dictionary &dict,
                        const uint32_t max_depth, std::string *err) {
  if (depth > max_depth) {
    if (err) {
      (*err) += "Too deep\n";
    }
    return false;
  }

  Dictionary variantInfos;

  if (prim.element_name().empty()) {
    if (err) {
      (*err) += "Prim name is empty.\n";
    }
    return false;
  }

  std::string full_prim_path = root_path + "/" + prim.element_name();

  if (prim.metas().variantSets) {
    const std::vector<std::string> &vsets =
        prim.metas().variantSets.value().second;
    MetaVariable var;
    var.set_value(vsets);
    variantInfos["variantSets"] = var;
  }

  if (prim.metas().variants) {
    Dictionary values;

    const VariantSelectionMap &vsmap = prim.metas().variants.value();
    for (const auto &item : vsmap) {
      MetaVariable var;
      var.set_value(item.second);

      values[item.first] = item.second;
    }

    variantInfos["variants"] = values;
  }

  // variantSetChildren Prim metadataum supercedes Prim's variantSets Stmt
  if (prim.metas().variantSetChildren) {
    const std::vector<value::token> &vsets =
        prim.metas().variantSetChildren.value();
    // to string
    std::vector<std::string> vsetchildren;
    for (const auto &item : vsets) {
      if (!item.valid()) {
        if (err) {
          (*err) += "Invalid variantSetChildren token found.\n";
        }
        return false;
      }
      vsetchildren.push_back(item.str());
    }
    variantInfos["variantSet"] = vsetchildren;
  } else if (prim.variantSets().size()) {
    Dictionary vsetdict;

    for (const auto &item : prim.variantSets()) {
      if (item.second.variantSet.size()) {
        std::vector<std::string> variantStmtNames;

        if (item.second.name.empty()) {
          if (err) {
            (*err) += "Invalid variantSets Statements found.\n";
          }
          return false;
        }

        for (const auto &v : item.second.variantSet) {
          variantStmtNames.push_back(v.first);
        }

        vsetdict[item.first] = variantStmtNames;
      }
    }

    if (vsetdict.size()) {
      variantInfos["variantSet"] = vsetdict;
    }
  }

  if (variantInfos.size()) {
    dict[full_prim_path] = variantInfos;
  }

  // Traverse children
  for (const auto &child : prim.children()) {
    if (!ExtractVariantsRec(depth + 1, full_prim_path, child, dict, max_depth,
                            err)) {
      return false;
    }
  }

  return true;
}